

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::DeleteLastProperty(PathTypeHandlerBase *this,DynamicObject *object)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint16 uVar5;
  uint16 uVar6;
  int iVar7;
  int iVar8;
  DynamicType *this_00;
  undefined4 *puVar9;
  DynamicTypeHandler *pDVar10;
  TypePath *this_01;
  bool isPredecessorTypeOHI;
  PathTypeHandlerBase *predecessorTypeHandler;
  bool isCurrentTypeOHI;
  DynamicType *predecessorType;
  DynamicObject *object_local;
  PathTypeHandlerBase *this_local;
  
  this_00 = GetPredecessorType(this);
  if (this_00 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x38a,"(predecessorType != nullptr)","predecessorType != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar2 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandlerUnchecked
                    (&this->super_DynamicTypeHandler);
  pDVar10 = DynamicType::GetTypeHandler(this_00);
  iVar7 = (*pDVar10->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x39a,"(predecessorType->GetTypeHandler()->IsPathTypeHandler())",
                                "predecessorType->GetTypeHandler()->IsPathTypeHandler()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pDVar10 = DynamicType::GetTypeHandler(this_00);
  uVar5 = DynamicTypeHandler::GetUnusedBytesValue(pDVar10);
  uVar6 = DynamicTypeHandler::GetUnusedBytesValue(&this->super_DynamicTypeHandler);
  if ((uint)uVar5 != uVar6 - 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x39d,
                                "(predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1))"
                                ,
                                "predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandlerUnchecked(pDVar10);
  if ((bVar2) && (!bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x3a1,"(!isCurrentTypeOHI || isPredecessorTypeOHI)",
                                "Current type is ObjectHeaderInlined but previous type is not ObjectHeaderInlined?"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (bVar2 == bVar3) {
    uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    uVar6 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar10);
    if (uVar5 != uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x3a5,
                                  "((isCurrentTypeOHI ^ isPredecessorTypeOHI) || (this->GetInlineSlotCapacity() == predecessorTypeHandler->GetInlineSlotCapacity()))"
                                  ,
                                  "When both types are ObjectHeaderInlined (or not ObjectHeaderInlined), InlineSlotCapacity of types should match"
                                 );
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  if ((!bVar2) && (bVar3)) {
    bVar2 = DynamicObject::HasObjectArray(object);
    if (bVar2) {
      return 0;
    }
    uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar10);
    uVar6 = DynamicTypeHandler::GetUnusedBytesValue(&this->super_DynamicTypeHandler);
    if ((uint)uVar5 != uVar6 - 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x3af,
                                  "(predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1))"
                                  ,
                                  "predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    MoveAuxSlotsToObjectHeader(this,object);
  }
  iVar7 = DynamicTypeHandler::GetSlotCapacity(pDVar10);
  iVar8 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (iVar8 < iVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x3b3,
                                "(predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity())"
                                ,
                                "predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  DynamicType::ShareType(this_00);
  this_01 = GetTypePath(this);
  TypePath::ClearSingletonInstanceIfSame(this_01,object);
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[99])(object,this_00);
  return 1;
}

Assistant:

BOOL PathTypeHandlerBase::DeleteLastProperty(DynamicObject *const object)
    {
        DynamicType* predecessorType = this->GetPredecessorType();
        Assert(predecessorType != nullptr);

        // -----------------------------------------------------------------------------------------
        //         Current Type     |      Predecessor Type      |       Action
        // -----------------------------------------------------------------------------------------
        //    ObjectHeaderInlined   |    ObjectHeaderInlined     | No movement needed
        // -----------------------------------------------------------------------------------------
        //    ObjectHeaderInlined   |  Not ObjectHeaderInlined   | Not possible (Should be a BUG)
        // -----------------------------------------------------------------------------------------
        //  Not ObjectHeaderInlined |  Not ObjectHeaderInlined   | No movement needed
        // -----------------------------------------------------------------------------------------
        //  Not ObjectHeaderInlined |    ObjectHeaderInlined     | Move from auxSlots to inline slots (ReOptimize)
        // -----------------------------------------------------------------------------------------

        bool isCurrentTypeOHI = this->IsObjectHeaderInlinedTypeHandlerUnchecked();

        Assert(predecessorType->GetTypeHandler()->IsPathTypeHandler());
        PathTypeHandlerBase* predecessorTypeHandler = (PathTypeHandlerBase*)predecessorType->GetTypeHandler();

        Assert(predecessorTypeHandler->GetUnusedBytesValue() == (this->GetUnusedBytesValue() - 1));

        bool isPredecessorTypeOHI = predecessorTypeHandler->IsObjectHeaderInlinedTypeHandlerUnchecked();

        AssertMsg(!isCurrentTypeOHI || isPredecessorTypeOHI, "Current type is ObjectHeaderInlined but previous type is not ObjectHeaderInlined?");

        AssertMsg((isCurrentTypeOHI ^ isPredecessorTypeOHI) ||
            (this->GetInlineSlotCapacity() == predecessorTypeHandler->GetInlineSlotCapacity()),
            "When both types are ObjectHeaderInlined (or not ObjectHeaderInlined), InlineSlotCapacity of types should match");

        if (!isCurrentTypeOHI && isPredecessorTypeOHI)
        {
            if (object->HasObjectArray())
            {
                // We can't move auxSlots
                return FALSE;
            }

            Assert(predecessorTypeHandler->GetInlineSlotCapacity() == (this->GetUnusedBytesValue() - 1));
            this->MoveAuxSlotsToObjectHeader(object);
        }

        Assert(predecessorTypeHandler->GetSlotCapacity() <= this->GetSlotCapacity());

        // Another type (this) reached the old (predecessorType) type so share it.
        // ShareType will take care of invalidating fixed fields and removing singleton object from predecessorType
        predecessorType->ShareType();

#if ENABLE_FIXED_FIELDS
        this->GetTypePath()->ClearSingletonInstanceIfSame(object);
#endif

        object->ReplaceTypeWithPredecessorType(predecessorType);

        return TRUE;
    }